

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundShape.cpp
# Opt level: O0

void __thiscall
btCompoundShape::addChildShape
          (btCompoundShape *this,btTransform *localTransform,btCollisionShape *shape)

{
  int iVar1;
  btScalar *pbVar2;
  btCollisionShape *in_RDX;
  undefined8 in_RSI;
  btDbvtVolume *in_RDI;
  size_t index;
  btDbvtVolume bounds;
  int i;
  btVector3 localAabbMax;
  btVector3 localAabbMin;
  btCompoundShapeChild child;
  undefined4 in_stack_ffffffffffffff28;
  btScalar bVar3;
  undefined4 in_stack_ffffffffffffff2c;
  btScalar in_stack_ffffffffffffff30;
  btScalar in_stack_ffffffffffffff34;
  btVector3 *in_stack_ffffffffffffff40;
  btCompoundShapeChild *in_stack_ffffffffffffff58;
  btAlignedObjectArray<btCompoundShapeChild> *in_stack_ffffffffffffff60;
  int local_94;
  btVector3 local_90;
  btVector3 local_80 [5];
  btCollisionShape *local_30;
  int local_28;
  btDbvtNode *local_20;
  btCollisionShape *local_18;
  undefined8 local_10;
  
  in_RDI[3].mi.m_floats[2] = (btScalar)((int)in_RDI[3].mi.m_floats[2] + 1);
  local_18 = in_RDX;
  local_10 = in_RSI;
  btCompoundShapeChild::btCompoundShapeChild((btCompoundShapeChild *)0x1ac16f);
  local_20 = (btDbvtNode *)0x0;
  btTransform::operator=
            ((btTransform *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (btTransform *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_30 = local_18;
  local_28 = btCollisionShape::getShapeType(local_18);
  (*local_18->_vptr_btCollisionShape[0xc])();
  btVector3::btVector3(local_80);
  btVector3::btVector3(&local_90);
  (*local_18->_vptr_btCollisionShape[2])(local_18,local_10,local_80,&local_90);
  for (local_94 = 0; local_94 < 3; local_94 = local_94 + 1) {
    pbVar2 = btVector3::operator_cast_to_float_(&in_RDI[2].mi);
    in_stack_ffffffffffffff34 = pbVar2[local_94];
    pbVar2 = btVector3::operator_cast_to_float_(local_80);
    if (pbVar2[local_94] <= in_stack_ffffffffffffff34 &&
        in_stack_ffffffffffffff34 != pbVar2[local_94]) {
      pbVar2 = btVector3::operator_cast_to_float_(local_80);
      in_stack_ffffffffffffff30 = pbVar2[local_94];
      pbVar2 = btVector3::operator_cast_to_float_(&in_RDI[2].mi);
      pbVar2[local_94] = in_stack_ffffffffffffff30;
    }
    pbVar2 = btVector3::operator_cast_to_float_(&in_RDI[2].mx);
    bVar3 = pbVar2[local_94];
    pbVar2 = btVector3::operator_cast_to_float_(&local_90);
    if (bVar3 < pbVar2[local_94]) {
      pbVar2 = btVector3::operator_cast_to_float_(&local_90);
      bVar3 = pbVar2[local_94];
      pbVar2 = btVector3::operator_cast_to_float_(&in_RDI[2].mx);
      pbVar2[local_94] = bVar3;
    }
  }
  if (*(long *)in_RDI[3].mi.m_floats != 0) {
    btDbvtAabbMm::FromMM(in_stack_ffffffffffffff40,&in_RDI->mi);
    iVar1 = btAlignedObjectArray<btCompoundShapeChild>::size
                      ((btAlignedObjectArray<btCompoundShapeChild> *)(in_RDI + 1));
    local_20 = btDbvt::insert((btDbvt *)(long)iVar1,in_RDI,
                              (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
    ;
  }
  btAlignedObjectArray<btCompoundShapeChild>::push_back
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  return;
}

Assistant:

void	btCompoundShape::addChildShape(const btTransform& localTransform,btCollisionShape* shape)
{
	m_updateRevision++;
	//m_childTransforms.push_back(localTransform);
	//m_childShapes.push_back(shape);
	btCompoundShapeChild child;
	child.m_node = 0;
	child.m_transform = localTransform;
	child.m_childShape = shape;
	child.m_childShapeType = shape->getShapeType();
	child.m_childMargin = shape->getMargin();

	
	//extend the local aabbMin/aabbMax
	btVector3 localAabbMin,localAabbMax;
	shape->getAabb(localTransform,localAabbMin,localAabbMax);
	for (int i=0;i<3;i++)
	{
		if (m_localAabbMin[i] > localAabbMin[i])
		{
			m_localAabbMin[i] = localAabbMin[i];
		}
		if (m_localAabbMax[i] < localAabbMax[i])
		{
			m_localAabbMax[i] = localAabbMax[i];
		}

	}
	if (m_dynamicAabbTree)
	{
		const btDbvtVolume	bounds=btDbvtVolume::FromMM(localAabbMin,localAabbMax);
		size_t index = m_children.size();
		child.m_node = m_dynamicAabbTree->insert(bounds,reinterpret_cast<void*>(index) );
	}

	m_children.push_back(child);

}